

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

bool Emitter::addEmitter(Junction *junc,double c,double e,Pattern *p)

{
  Emitter *this;
  
  this = junc->emitter;
  if (this == (Emitter *)0x0) {
    this = (Emitter *)operator_new(0x18);
    Emitter(this);
    junc->emitter = this;
  }
  this->flowCoeff = c;
  this->expon = e;
  this->timePattern = p;
  return true;
}

Assistant:

bool Emitter::addEmitter(Junction* junc, double c, double e, Pattern* p)
{
    if ( junc->emitter == nullptr )
    {
        junc->emitter = new Emitter();
        if ( junc->emitter == nullptr ) return false;
    }
    junc->emitter->flowCoeff = c;
    junc->emitter->expon = e;
    junc->emitter->timePattern = p;
    return true;
}